

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O0

StatementContext psy::C::operator+(StatementContext a,StatementContext b)

{
  ostream *poVar1;
  StatementContext local_9;
  StatementContext b_local;
  StatementContext a_local;
  
  local_9 = a;
  switch(a) {
  case None:
    local_9 = b;
    break;
  case Switch:
    if (b == Loop) {
      local_9 = SwitchAndLoop;
    }
    break;
  case Loop:
    if (b == Switch) {
      local_9 = SwitchAndLoop;
    }
    break;
  case SwitchAndLoop:
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x41f);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_9 = None;
  }
  return local_9;
}

Assistant:

Parser::StatementContext operator+(Parser::StatementContext a,
                                   Parser::StatementContext b)
{
    switch (a) {
        case Parser::StatementContext::None:
            return b;

        case Parser::StatementContext::Switch:
            if (b == Parser::StatementContext::Loop)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::Loop:
            if (b == Parser::StatementContext::Switch)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::SwitchAndLoop:
            return a;

        default:
            PSY_ASSERT_3(false, return Parser::StatementContext::None, "");
    }
}